

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O0

utf8proc_bool grapheme_break_simple(int lbc,int tbc)

{
  utf8proc_bool uVar1;
  int tbc_local;
  int lbc_local;
  
  if (lbc == 0) {
    uVar1 = true;
  }
  else if ((lbc == 2) && (tbc == 3)) {
    uVar1 = false;
  }
  else if ((lbc < 2) || (4 < lbc)) {
    if ((tbc < 2) || (4 < tbc)) {
      if ((lbc == 6) && ((((tbc == 6 || (tbc == 7)) || (tbc == 9)) || (tbc == 10)))) {
        uVar1 = false;
      }
      else if (((lbc == 9) || (lbc == 7)) && ((tbc == 7 || (tbc == 8)))) {
        uVar1 = false;
      }
      else if (((lbc == 10) || (lbc == 8)) && (tbc == 8)) {
        uVar1 = false;
      }
      else if ((((tbc == 5) || (tbc == 0xe)) || (tbc == 0xc)) || (lbc == 0xd)) {
        uVar1 = false;
      }
      else if ((lbc == 0x14) && (tbc == 0x13)) {
        uVar1 = false;
      }
      else {
        uVar1 = lbc != 0xb || tbc != 0xb;
      }
    }
    else {
      uVar1 = true;
    }
  }
  else {
    uVar1 = true;
  }
  return uVar1;
}

Assistant:

static utf8proc_bool grapheme_break_simple(int lbc, int tbc) {
  return
    (lbc == UTF8PROC_BOUNDCLASS_START) ? true :       // GB1
    (lbc == UTF8PROC_BOUNDCLASS_CR &&                 // GB3
     tbc == UTF8PROC_BOUNDCLASS_LF) ? false :         // ---
    (lbc >= UTF8PROC_BOUNDCLASS_CR && lbc <= UTF8PROC_BOUNDCLASS_CONTROL) ? true :  // GB4
    (tbc >= UTF8PROC_BOUNDCLASS_CR && tbc <= UTF8PROC_BOUNDCLASS_CONTROL) ? true :  // GB5
    (lbc == UTF8PROC_BOUNDCLASS_L &&                  // GB6
     (tbc == UTF8PROC_BOUNDCLASS_L ||                 // ---
      tbc == UTF8PROC_BOUNDCLASS_V ||                 // ---
      tbc == UTF8PROC_BOUNDCLASS_LV ||                // ---
      tbc == UTF8PROC_BOUNDCLASS_LVT)) ? false :      // ---
    ((lbc == UTF8PROC_BOUNDCLASS_LV ||                // GB7
      lbc == UTF8PROC_BOUNDCLASS_V) &&                // ---
     (tbc == UTF8PROC_BOUNDCLASS_V ||                 // ---
      tbc == UTF8PROC_BOUNDCLASS_T)) ? false :        // ---
    ((lbc == UTF8PROC_BOUNDCLASS_LVT ||               // GB8
      lbc == UTF8PROC_BOUNDCLASS_T) &&                // ---
     tbc == UTF8PROC_BOUNDCLASS_T) ? false :          // ---
    (tbc == UTF8PROC_BOUNDCLASS_EXTEND ||             // GB9
     tbc == UTF8PROC_BOUNDCLASS_ZWJ ||                // ---
     tbc == UTF8PROC_BOUNDCLASS_SPACINGMARK ||        // GB9a
     lbc == UTF8PROC_BOUNDCLASS_PREPEND) ? false :    // GB9b
    (lbc == UTF8PROC_BOUNDCLASS_E_ZWG &&              // GB11 (requires additional handling below)
     tbc == UTF8PROC_BOUNDCLASS_EXTENDED_PICTOGRAPHIC) ? false : // ----
    (lbc == UTF8PROC_BOUNDCLASS_REGIONAL_INDICATOR &&          // GB12/13 (requires additional handling below)
     tbc == UTF8PROC_BOUNDCLASS_REGIONAL_INDICATOR) ? false :  // ----
    true; // GB999
}